

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int evthread_notify_base(event_base *base)

{
  int iVar1;
  
  if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
    iVar1 = evthread_is_debug_lock_held_(base->th_base_lock);
    if (iVar1 == 0) {
      evthread_notify_base_cold_1();
    }
  }
  if (base->th_notify_fn == (_func_int_event_base_ptr *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (base->is_notify_pending == 0) {
      base->is_notify_pending = 1;
      iVar1 = (*base->th_notify_fn)(base);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int
evthread_notify_base(struct event_base *base)
{
	EVENT_BASE_ASSERT_LOCKED(base);
	if (!base->th_notify_fn)
		return -1;
	if (base->is_notify_pending)
		return 0;
	base->is_notify_pending = 1;
	return base->th_notify_fn(base);
}